

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void Js::ConfigFlagsTable::PrintUsageString(void)

{
  code *pcVar1;
  bool bVar2;
  FlagTypes FVar3;
  undefined4 *puVar4;
  int local_10;
  int local_c;
  int i_1;
  int i;
  
  Output::Print(L"List of Phases:\n");
  for (local_c = 0; local_c < 0x175; local_c = local_c + 1) {
    if (local_c % 4 == 0) {
      Output::Print(L"\n  ");
    }
    Output::Print(L"%-40ls ",*(undefined8 *)(PhaseNames + (long)local_c * 8));
  }
  Output::Print(L"\n\nList of flags:\n\n");
  local_10 = 0;
  do {
    if (0x1d5 < local_10) {
      return;
    }
    Output::Print(L"%60ls ",*(undefined8 *)(FlagNames + (long)local_10 * 8));
    FVar3 = GetFlagType((Flag)local_10);
    switch(FVar3) {
    case InvalidFlagType:
      break;
    case FlagString:
      Output::Print(L"[:String]        ");
      break;
    case FlagPhases:
      Output::Print(L"[:Phase]         ");
      break;
    case FlagNumber:
      Output::Print(L"[:Number]        ");
      break;
    case FlagBoolean:
      Output::Print(L"                 ");
      break;
    case FlagNumberSet:
      Output::Print(L"[:NumberSet]     ");
      break;
    case FlagNumberPairSet:
      Output::Print(L"[:NumberPairSet] ");
      break;
    case FlagNumberTrioSet:
      Output::Print(L"[:NumberTrioSet] ");
      break;
    case FlagNumberRange:
      Output::Print(L"[:NumberRange]   ");
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                  ,0x398,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    Output::Print(L"%ls\n",*(undefined8 *)(FlagDescriptions + (long)local_10 * 8));
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void
    ConfigFlagsTable::PrintUsageString()
    {
        Output::Print(_u("List of Phases:\n"));
        for(int i = 0; i < PhaseCount; i++)
        {
            if (i % 4 == 0)
            {
                Output::Print(_u("\n  "));
            }
            Output::Print(_u("%-40ls "), PhaseNames[i]);
        }

        Output::Print(_u("\n\nList of flags:\n\n"));
        for(int i = 0; i < FlagCount; i++)
        {
            Output::Print(_u("%60ls "), FlagNames[i]);
            switch(GetFlagType(Flag(i)))
            {
            case InvalidFlagType:
                break;
            case FlagString:
                Output::Print(_u("[:String]        "));
                break;
            case FlagPhases:
                Output::Print(_u("[:Phase]         "));
                break;
            case FlagNumber:
                Output::Print(_u("[:Number]        "));
                break;
            case FlagBoolean:
                Output::Print(_u("                 "));
                break;
            case FlagNumberSet:
                Output::Print(_u("[:NumberSet]     "));
                break;
            case FlagNumberPairSet:
                Output::Print(_u("[:NumberPairSet] "));
                break;
            case FlagNumberTrioSet:
                Output::Print(_u("[:NumberTrioSet] "));
                break;
            case FlagNumberRange:
                Output::Print(_u("[:NumberRange]   "));
                break;
            default:
                Assert(false);
                __assume(false);
            }
            Output::Print(_u("%ls\n"), FlagDescriptions[i]);
        }
    }